

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitDrop(I64ToI32Lowering *this,Drop *curr)

{
  bool bVar1;
  TempVar local_38;
  
  bVar1 = hasOutParam(this,curr->value);
  if (bVar1) {
    fetchOutParam(&local_38,this,curr->value);
    TempVar::~TempVar(&local_38);
  }
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    if (!hasOutParam(curr->value)) {
      return;
    }
    // free temp var
    fetchOutParam(curr->value);
  }